

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

bool __thiscall CS248::Shader::createVertexShader(Shader *this,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  Shader *in_RSI;
  char *source;
  string contents;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  char *in_stack_ffffffffffffff88;
  GLResourceManager *in_stack_ffffffffffffff90;
  string local_38 [16];
  string *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  bool local_1;
  
  std::__cxx11::string::string(local_38);
  bVar1 = prepareSourceCode(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (bVar1) {
    std::__cxx11::string::c_str();
    bVar1 = GLResourceManager::createVertexShader
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       (ShaderId *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to read ");
    poVar2 = std::operator<<(poVar2,(string *)in_RSI);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  std::__cxx11::string::~string(local_38);
  return local_1;
}

Assistant:

bool Shader::createVertexShader(const std::string& filename) {
  std::string contents;
  if (!prepareSourceCode(filename, &contents)) {
    cerr << "Failed to read " << filename << endl;
    return false;
  }
  const char* source = contents.c_str();
  if (!gl_mgr_->createVertexShader(source, &vertexShaderId_)) {
    return false;
  }
  return true;
}